

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O0

void __thiscall Stereo_Buffer::end_frame(Stereo_Buffer *this,blip_time_t clock_count,bool stereo)

{
  byte in_DL;
  Blip_Buffer *in_RDI;
  uint i;
  blip_time_t in_stack_ffffffffffffffd8;
  uint local_18;
  
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    Blip_Buffer::end_frame(in_RDI,in_stack_ffffffffffffffd8);
  }
  *(bool *)&in_RDI[3].samples_per_sec = (in_RDI[3].samples_per_sec & 1) != 0 || (in_DL & 1) != 0;
  return;
}

Assistant:

void Stereo_Buffer::end_frame( blip_time_t clock_count, bool stereo )
{
	for ( unsigned i = 0; i < buf_count; i++ )
		bufs [i].end_frame( clock_count );
	
	stereo_added |= stereo;
}